

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

int ReadHuffmanCodesHelper
              (int color_cache_bits,int num_htree_groups,int num_htree_groups_max,int *mapping,
              VP8LDecoder *dec,HuffmanTables *huffman_tables,HTreeGroup **htree_groups)

{
  HuffmanCode **ppHVar1;
  byte bVar2;
  ushort uVar3;
  HuffmanCode HVar4;
  HTreeGroup *pHVar5;
  HuffmanCode *pHVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int *code_lengths;
  HTreeGroup *pHVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  int local_7c;
  int local_74;
  
  iVar14 = 1 << ((byte)color_cache_bits & 0x1f);
  iVar10 = 0;
  bVar19 = true;
  if ((num_htree_groups_max < num_htree_groups) ||
     (num_htree_groups != num_htree_groups_max && mapping == (int *)0x0)) {
    code_lengths = (int *)0x0;
  }
  else {
    uVar3 = kTableSize[color_cache_bits];
    iVar8 = iVar14 + 0x118;
    if (color_cache_bits < 1) {
      iVar8 = 0x118;
    }
    code_lengths = (int *)WebPSafeCalloc((long)iVar8,4);
    pHVar11 = VP8LHtreeGroupsNew(num_htree_groups);
    *htree_groups = pHVar11;
    if (((pHVar11 == (HTreeGroup *)0x0) || (code_lengths == (int *)0x0)) ||
       (iVar8 = VP8LHuffmanTablesAllocate((uint)uVar3 * num_htree_groups,huffman_tables), iVar8 == 0
       )) {
      if ((dec->status == VP8_STATUS_SUSPENDED) || (dec->status == VP8_STATUS_OK)) {
        dec->status = VP8_STATUS_OUT_OF_MEMORY;
      }
    }
    else {
      if (0 < num_htree_groups_max) {
        uVar13 = 0;
        do {
          if ((mapping == (int *)0x0) || (mapping[uVar13] != -1)) {
            if (mapping == (int *)0x0) {
              iVar10 = (int)uVar13;
            }
            else {
              iVar10 = mapping[uVar13];
            }
            pHVar5 = *htree_groups;
            pHVar11 = pHVar5 + iVar10;
            uVar9 = 1;
            uVar17 = 0;
            local_74 = 0;
            local_7c = 0;
            do {
              iVar8 = 0;
              if (uVar17 == 0) {
                iVar8 = iVar14;
              }
              if (color_cache_bits < 1) {
                iVar8 = 0;
              }
              uVar18 = iVar8 + (uint)kAlphabetSize[uVar17];
              iVar8 = ReadHuffmanCode(uVar18,dec,code_lengths,huffman_tables);
              pHVar6 = huffman_tables->curr_segment->curr_table;
              pHVar11->htrees[uVar17] = pHVar6;
              if (iVar8 == 0) {
                bVar7 = true;
              }
              else {
                bVar19 = uVar9 != 0;
                uVar9 = 0;
                if (bVar19) {
                  if ((uVar17 & 3) == 0) {
                    uVar9 = 1;
                  }
                  else {
                    uVar9 = (uint)(pHVar6->bits == '\0');
                  }
                }
                local_7c = local_7c + (uint)pHVar6->bits;
                ppHVar1 = &huffman_tables->curr_segment->curr_table;
                *ppHVar1 = *ppHVar1 + iVar8;
                bVar7 = false;
                if (uVar17 != 4) {
                  iVar12 = *code_lengths;
                  if (1 < (int)uVar18) {
                    uVar15 = 1;
                    do {
                      if (iVar12 < code_lengths[uVar15]) {
                        iVar12 = code_lengths[uVar15];
                      }
                      uVar15 = uVar15 + 1;
                    } while (uVar18 != uVar15);
                  }
                  local_74 = local_74 + iVar12;
                  bVar7 = false;
                }
              }
              if (iVar8 == 0) goto LAB_00109bf1;
              uVar17 = uVar17 + 1;
            } while (uVar17 != 5);
            pHVar11->is_trivial_literal = uVar9;
            pHVar11->is_trivial_code = 0;
            if (uVar9 != 0) {
              uVar9 = CONCAT22(pHVar11->htrees[1]->value,pHVar11->htrees[2]->value) |
                      (uint)pHVar11->htrees[3]->value << 0x18;
              pHVar11->literal_arb = uVar9;
              if ((local_7c == 0) && (uVar3 = pHVar11->htrees[0]->value, uVar3 < 0x100)) {
                pHVar11->is_trivial_code = 1;
                pHVar11->literal_arb = uVar9 | (uint)uVar3 << 8;
              }
            }
            bVar19 = pHVar11->is_trivial_code == 0;
            pHVar11->use_packed_table = (uint)(local_74 < 6 && bVar19);
            bVar7 = false;
            if (local_74 < 6 && bVar19) {
              pHVar6 = pHVar11->htrees[0];
              lVar16 = 0;
              do {
                bVar2 = pHVar6[lVar16].bits;
                uVar3 = pHVar6[lVar16].value;
                if (uVar3 < 0x100) {
                  pHVar5[iVar10].packed_table[lVar16].bits = (uint)bVar2;
                  uVar9 = (uint)lVar16 >> (bVar2 & 0x1f);
                  pHVar5[iVar10].packed_table[lVar16].value = (uint)uVar3 << 8;
                  HVar4 = pHVar11->htrees[1][uVar9];
                  iVar8 = ((uint)HVar4 & 0xff) + (uint)bVar2;
                  pHVar5[iVar10].packed_table[lVar16].bits = iVar8;
                  uVar18 = (uint)HVar4 & 0xffff0000 | (uint)uVar3 << 8;
                  pHVar5[iVar10].packed_table[lVar16].value = uVar18;
                  uVar9 = uVar9 >> (HVar4.bits & 0x1f);
                  HVar4 = pHVar11->htrees[2][uVar9];
                  iVar8 = ((uint)HVar4 & 0xff) + iVar8;
                  pHVar5[iVar10].packed_table[lVar16].bits = iVar8;
                  uVar18 = (uint)HVar4 >> 0x10 | uVar18;
                  pHVar5[iVar10].packed_table[lVar16].value = uVar18;
                  HVar4 = pHVar11->htrees[3][uVar9 >> (HVar4.bits & 0x1f)];
                  pHVar5[iVar10].packed_table[lVar16].bits = ((uint)HVar4 & 0xff) + iVar8;
                  pHVar5[iVar10].packed_table[lVar16].value = ((uint)HVar4 & 0xff0000) << 8 | uVar18
                  ;
                }
                else {
                  pHVar5[iVar10].packed_table[lVar16].bits = bVar2 | 0x100;
                  pHVar5[iVar10].packed_table[lVar16].value = (uint)uVar3;
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 != 0x40);
            }
LAB_00109bf1:
            if (bVar7) {
              iVar10 = 0;
              bVar19 = true;
              if (!bVar7) {
                return 0;
              }
              goto LAB_00109c8c;
            }
          }
          else {
            lVar16 = 0;
            do {
              iVar10 = 0;
              if (lVar16 == 0) {
                iVar10 = iVar14;
              }
              if (color_cache_bits < 1) {
                iVar10 = 0;
              }
              iVar10 = ReadHuffmanCode(iVar10 + (uint)*(ushort *)((long)kAlphabetSize + lVar16),dec,
                                       code_lengths,(HuffmanTables *)0x0);
              if (iVar10 == 0) {
                iVar10 = 0;
                bVar19 = true;
                goto LAB_00109c8c;
              }
              lVar16 = lVar16 + 2;
            } while (lVar16 != 10);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uint)num_htree_groups_max);
      }
      iVar10 = 1;
      bVar19 = false;
    }
  }
LAB_00109c8c:
  WebPSafeFree(code_lengths);
  if (bVar19) {
    VP8LHuffmanTablesDeallocate(huffman_tables);
    VP8LHtreeGroupsFree(*htree_groups);
    *htree_groups = (HTreeGroup *)0x0;
  }
  return iVar10;
}

Assistant:

int ReadHuffmanCodesHelper(int color_cache_bits, int num_htree_groups,
                           int num_htree_groups_max, const int* const mapping,
                           VP8LDecoder* const dec,
                           HuffmanTables* const huffman_tables,
                           HTreeGroup** const htree_groups) {
  int i, j, ok = 0;
  const int max_alphabet_size =
      kAlphabetSize[0] + ((color_cache_bits > 0) ? 1 << color_cache_bits : 0);
  const int table_size = kTableSize[color_cache_bits];
  int* code_lengths = NULL;

  if ((mapping == NULL && num_htree_groups != num_htree_groups_max) ||
      num_htree_groups > num_htree_groups_max) {
    goto Error;
  }

  code_lengths =
      (int*)WebPSafeCalloc((uint64_t)max_alphabet_size, sizeof(*code_lengths));
  *htree_groups = VP8LHtreeGroupsNew(num_htree_groups);

  if (*htree_groups == NULL || code_lengths == NULL ||
      !VP8LHuffmanTablesAllocate(num_htree_groups * table_size,
                                 huffman_tables)) {
    VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
    goto Error;
  }

  for (i = 0; i < num_htree_groups_max; ++i) {
    // If the index "i" is unused in the Huffman image, just make sure the
    // coefficients are valid but do not store them.
    if (mapping != NULL && mapping[i] == -1) {
      for (j = 0; j < HUFFMAN_CODES_PER_META_CODE; ++j) {
        int alphabet_size = kAlphabetSize[j];
        if (j == 0 && color_cache_bits > 0) {
          alphabet_size += (1 << color_cache_bits);
        }
        // Passing in NULL so that nothing gets filled.
        if (!ReadHuffmanCode(alphabet_size, dec, code_lengths, NULL)) {
          goto Error;
        }
      }
    } else {
      HTreeGroup* const htree_group =
          &(*htree_groups)[(mapping == NULL) ? i : mapping[i]];
      HuffmanCode** const htrees = htree_group->htrees;
      int size;
      int total_size = 0;
      int is_trivial_literal = 1;
      int max_bits = 0;
      for (j = 0; j < HUFFMAN_CODES_PER_META_CODE; ++j) {
        int alphabet_size = kAlphabetSize[j];
        if (j == 0 && color_cache_bits > 0) {
          alphabet_size += (1 << color_cache_bits);
        }
        size =
            ReadHuffmanCode(alphabet_size, dec, code_lengths, huffman_tables);
        htrees[j] = huffman_tables->curr_segment->curr_table;
        if (size == 0) {
          goto Error;
        }
        if (is_trivial_literal && kLiteralMap[j] == 1) {
          is_trivial_literal = (htrees[j]->bits == 0);
        }
        total_size += htrees[j]->bits;
        huffman_tables->curr_segment->curr_table += size;
        if (j <= ALPHA) {
          int local_max_bits = code_lengths[0];
          int k;
          for (k = 1; k < alphabet_size; ++k) {
            if (code_lengths[k] > local_max_bits) {
              local_max_bits = code_lengths[k];
            }
          }
          max_bits += local_max_bits;
        }
      }
      htree_group->is_trivial_literal = is_trivial_literal;
      htree_group->is_trivial_code = 0;
      if (is_trivial_literal) {
        const int red = htrees[RED][0].value;
        const int blue = htrees[BLUE][0].value;
        const int alpha = htrees[ALPHA][0].value;
        htree_group->literal_arb = ((uint32_t)alpha << 24) | (red << 16) | blue;
        if (total_size == 0 && htrees[GREEN][0].value < NUM_LITERAL_CODES) {
          htree_group->is_trivial_code = 1;
          htree_group->literal_arb |= htrees[GREEN][0].value << 8;
        }
      }
      htree_group->use_packed_table =
          !htree_group->is_trivial_code && (max_bits < HUFFMAN_PACKED_BITS);
      if (htree_group->use_packed_table) BuildPackedTable(htree_group);
    }
  }
  ok = 1;

 Error:
  WebPSafeFree(code_lengths);
  if (!ok) {
    VP8LHuffmanTablesDeallocate(huffman_tables);
    VP8LHtreeGroupsFree(*htree_groups);
    *htree_groups = NULL;
  }
  return ok;
}